

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

int __thiscall QTextDocumentPrivate::undoRedo(QTextDocumentPrivate *this,bool undo)

{
  BlockMap *this_00;
  pointer pQVar1;
  ushort uVar2;
  quint32 pos;
  _func_int **pp_Var3;
  QTextBlockData *pQVar4;
  Header *pHVar5;
  QTextUndoCommand *pQVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  pointer pQVar12;
  long *plVar13;
  long *plVar14;
  long lVar15;
  QTextObject *obj;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long in_FS_OFFSET;
  int local_a0;
  QTextFormat local_68;
  undefined1 local_58 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar18 = 0xffffffff;
  if (((this->undoEnabled == true) && (!undo || this->undoState != 0)) &&
     ((undo || ((this->undoStack).d.size != (long)this->undoState)))) {
    this->undoEnabled = false;
    iVar11 = this->editBlock;
    this->editBlock = iVar11 + 1;
    if (iVar11 == 0) {
      this->revision = this->revision + 1;
    }
    this_00 = &this->blocks;
    local_a0 = -1;
    do {
      if (undo) {
        this->undoState = this->undoState + -1;
      }
      iVar11 = this->undoState;
      pQVar12 = QList<QTextUndoCommand>::data(&this->undoStack);
      pQVar1 = pQVar12 + iVar11;
      uVar17 = pQVar12[iVar11].pos;
      uVar2 = pQVar12[iVar11].command;
      iVar11 = (int)&this->formats;
      switch(uVar2) {
      case 0:
        remove(this,(char *)(ulong)uVar17);
        pQVar1->command = 1;
        goto LAB_004dd2a5;
      case 1:
        insert_string(this,uVar17,pQVar1->strPos,(pQVar1->field_8).length,pQVar1->format,
                      (uint)pQVar1->operation);
        pQVar1->command = 0;
        uVar19 = pQVar1->pos;
        if (uVar18 != uVar19) {
          local_a0 = 0;
        }
        local_a0 = local_a0 + (pQVar1->field_8).blockFormat;
        break;
      case 2:
        uVar10 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,uVar17,0);
        iVar9 = (this->fragments).data.field_0.fragments[uVar10].format;
        pos = pQVar1->pos;
        iVar8 = (pQVar1->field_8).blockFormat;
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar11);
        QTextFormat::toCharFormat((QTextFormat *)local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        setCharFormat(this,pos,iVar8,(QTextCharFormat *)local_58,SetFormat);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        pQVar1->format = iVar9;
        uVar19 = pQVar1->pos;
        if (uVar18 != uVar19) {
          local_a0 = 0;
        }
        uVar17 = 0xffffffff;
        local_a0 = local_a0 + (pQVar1->field_8).blockFormat;
        break;
      case 3:
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        uVar10 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pQVar1->pos,0);
        local_58._8_4_ = uVar10;
        pQVar4 = (this->blocks).data.field_0.fragments;
        iVar9 = pQVar4[uVar10].format;
        pQVar4[uVar10].format = pQVar1->format;
        local_58._0_8_ = this;
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar11);
        QTextFormat::toBlockFormat(&local_68);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        iVar8 = QTextFormat::objectIndex(&local_68);
        objectForIndex(this,iVar8);
        plVar13 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
        QTextFormat::~QTextFormat(&local_68);
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar11);
        QTextFormat::toBlockFormat(&local_68);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        iVar11 = QTextFormat::objectIndex(&local_68);
        objectForIndex(this,iVar11);
        plVar14 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
        QTextFormat::~QTextFormat(&local_68);
        pQVar1->format = iVar9;
        if (plVar14 == plVar13) {
          lVar15 = 0x70;
        }
        else {
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 0x68))(plVar13,local_58);
          }
          lVar15 = 0x60;
        }
        if (plVar14 != (long *)0x0) {
          (**(code **)(*plVar14 + lVar15))(plVar14,(QTextBlock *)local_58);
        }
        iVar11 = QTextBlock::position((QTextBlock *)local_58);
        iVar9 = QTextBlock::length((QTextBlock *)local_58);
        documentChange(this,iVar11,iVar9);
        goto LAB_004dd371;
      case 4:
      case 6:
        remove_block(this,uVar17,&(pQVar1->field_8).blockFormat,(uint)uVar2,(uint)pQVar1->operation)
        ;
        pQVar1->command = (ushort)(pQVar1->command != 4) * 2 + 5;
LAB_004dd2a5:
        uVar19 = pQVar1->pos;
        local_a0 = 0;
        break;
      case 5:
      case 7:
        insert_block(this,uVar17,pQVar1->strPos,pQVar1->format,(pQVar1->field_8).blockFormat,
                     (uint)pQVar1->operation,(uint)uVar2);
        uVar17 = uVar17 + 1;
        pQVar1->command = (ushort)(pQVar1->command != 5) * 2 + 4;
        uVar19 = pQVar1->pos;
        local_a0 = local_a0 + 1;
        if (uVar18 != uVar19) {
          local_a0 = 1;
        }
        break;
      case 8:
        obj = objectForIndex(this,(pQVar1->field_8).blockFormat);
        iVar11 = QTextFormatCollection::objectFormatIndex
                           (&this->formats,(pQVar1->field_8).blockFormat);
        changeObjectFormat(this,obj,pQVar1->format);
        pQVar1->format = iVar11;
LAB_004dd371:
        uVar17 = 0xffffffff;
        uVar19 = 0xffffffff;
        break;
      case 9:
        local_a0 = 0;
        uVar19 = uVar17;
        break;
      default:
        uVar19 = uVar18;
        if (uVar2 == 0x100) {
          pp_Var3 = ((pQVar1->field_8).custom)->_vptr_QAbstractUndoItem;
          if (undo) {
            (*pp_Var3[2])();
          }
          else {
            (*pp_Var3[3])();
          }
          goto LAB_004dd371;
        }
      }
      if (-1 < (int)uVar17) {
        uVar10 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,uVar17,0);
        pHVar5 = (this_00->data).field_0.head;
        *(uint *)((long)pHVar5 + (ulong)uVar10 * 0x48 + 0x44) =
             *(uint *)((long)pHVar5 + (ulong)uVar10 * 0x48 + 0x44) & 0x80000000 |
             pQVar1->revision & 0x7fffffff;
      }
      if (!undo) {
        this->undoState = this->undoState + 1;
      }
      uVar16 = (ulong)this->undoState;
      if (((long)uVar16 < 1) || ((ulong)(this->undoStack).d.size <= uVar16)) goto LAB_004dd3f9;
      pQVar6 = (this->undoStack).d.ptr;
      if (((pQVar6[uVar16].field_0x2 & 1) == 0) ||
         (uVar18 = uVar19, (pQVar6[uVar16 - 1].field_0x2 & 3) != 1)) goto LAB_004dd3f9;
    } while( true );
  }
LAB_004dd4a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar18;
LAB_004dd3f9:
  this->undoEnabled = true;
  if ((int)uVar19 < 0) {
    if (this->docChangeFrom < 0) {
      uVar18 = 0xffffffff;
    }
    else {
      uVar17 = this->docChangeFrom + this->docChangeLength;
      iVar11 = QFragmentMapData<QTextFragmentData>::length(&(this->fragments).data,0);
      uVar18 = iVar11 - 1U;
      if ((int)uVar17 < (int)(iVar11 - 1U)) {
        uVar18 = uVar17;
      }
    }
  }
  else {
    uVar18 = uVar19 + local_a0;
  }
  endEditBlock(this);
  bVar7 = (bool)(0 < this->undoState & this->undoEnabled);
  if (this->wasUndoAvailable != bVar7) {
    QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,bVar7);
    this->wasUndoAvailable = bVar7;
  }
  if (this->undoEnabled == true) {
    bVar7 = (long)this->undoState < (this->undoStack).d.size;
  }
  else {
    bVar7 = false;
  }
  if (this->wasRedoAvailable != bVar7) {
    QTextDocument::redoAvailable(*(QTextDocument **)&this->field_0x8,bVar7);
    this->wasRedoAvailable = bVar7;
  }
  goto LAB_004dd4a2;
}

Assistant:

int QTextDocumentPrivate::undoRedo(bool undo)
{
    PMDEBUG("%s, undoState=%d, undoStack size=%d", undo ? "undo:" : "redo:", undoState, int(undoStack.size()));
    if (!undoEnabled || (undo && undoState == 0) || (!undo && undoState == undoStack.size()))
        return -1;

    undoEnabled = false;
    beginEditBlock();
    int editPos = -1;
    int editLength = -1;
    while (1) {
        if (undo)
            --undoState;
        QTextUndoCommand &c = undoStack[undoState];
        int resetBlockRevision = c.pos;

        switch (c.command) {
        case QTextUndoCommand::Inserted:
            remove(c.pos, c.length, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   erase: from %d, length %d", c.pos, c.length);
            c.command = QTextUndoCommand::Removed;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Removed:
            PMDEBUG("   insert: format %d (from %d, length %d, strpos=%d)", c.format, c.pos, c.length, c.strPos);
            insert_string(c.pos, c.strPos, c.length, c.format, (QTextUndoCommand::Operation)c.operation);
            c.command = QTextUndoCommand::Inserted;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        case QTextUndoCommand::BlockInserted:
        case QTextUndoCommand::BlockAdded:
            remove_block(c.pos, &c.blockFormat, c.command, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   blockremove: from %d", c.pos);
            if (c.command == QTextUndoCommand::BlockInserted)
                c.command = QTextUndoCommand::BlockRemoved;
            else
                c.command = QTextUndoCommand::BlockDeleted;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::BlockRemoved:
        case QTextUndoCommand::BlockDeleted:
            PMDEBUG("   blockinsert: charformat %d blockformat %d (pos %d, strpos=%d)", c.format, c.blockFormat, c.pos, c.strPos);
            insert_block(c.pos, c.strPos, c.format, c.blockFormat, (QTextUndoCommand::Operation)c.operation, c.command);
            resetBlockRevision += 1;
            if (c.command == QTextUndoCommand::BlockRemoved)
                c.command = QTextUndoCommand::BlockInserted;
            else
                c.command = QTextUndoCommand::BlockAdded;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += 1;
            break;
        case QTextUndoCommand::CharFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   charFormat: format %d (from %d, length %d)", c.format, c.pos, c.length);
            FragmentIterator it = find(c.pos);
            Q_ASSERT(!it.atEnd());

            int oldFormat = it.value()->format;
            setCharFormat(c.pos, c.length, formats.charFormat(c.format));
            c.format = oldFormat;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        }
        case QTextUndoCommand::BlockFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   blockformat: format %d pos %d", c.format, c.pos);
            QTextBlock it = blocksFind(c.pos);
            Q_ASSERT(it.isValid());

            int oldFormat = block(it)->format;
            block(it)->format = c.format;
            QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(oldFormat)));
            QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(c.format)));
            c.format = oldFormat;
            if (group != oldGroup) {
                if (oldGroup)
                    oldGroup->blockRemoved(it);
                if (group)
                    group->blockInserted(it);
            } else if (group) {
                group->blockFormatChanged(it);
            }
            documentChange(it.position(), it.length());
            editPos = -1;
            break;
        }
        case QTextUndoCommand::GroupFormatChange: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   group format change");
            QTextObject *object = objectForIndex(c.objectIndex);
            int oldFormat = formats.objectFormatIndex(c.objectIndex);
            changeObjectFormat(object, c.format);
            c.format = oldFormat;
            editPos = -1;
            break;
        }
        case QTextUndoCommand::CursorMoved:
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Custom:
            resetBlockRevision = -1; // ## TODO
            if (undo)
                c.custom->undo();
            else
                c.custom->redo();
            editPos = -1;
            break;
        default:
            Q_ASSERT(false);
        }

        if (resetBlockRevision >= 0) {
            int b = blocks.findNode(resetBlockRevision);
            QTextBlockData *B = blocks.fragment(b);
            B->revision = c.revision;
        }

        if (!undo)
            ++undoState;

        bool inBlock = (
                undoState > 0
                && undoState < undoStack.size()
                && undoStack.at(undoState).block_part
                && undoStack.at(undoState - 1).block_part
                && !undoStack.at(undoState - 1).block_end
                );
        if (!inBlock)
            break;
    }
    undoEnabled = true;

    int newCursorPos = -1;

    if (editPos >=0)
        newCursorPos = editPos + editLength;
    else if (docChangeFrom >= 0)
        newCursorPos= qMin(docChangeFrom + docChangeLength, length() - 1);

    endEditBlock();
    emitUndoAvailable(isUndoAvailable());
    emitRedoAvailable(isRedoAvailable());

    return newCursorPos;
}